

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O2

void __thiscall
DWallScrollInterpolation::Interpolate(DWallScrollInterpolation *this,double smoothratio)

{
  double dVar1;
  int iVar2;
  side_t *psVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  psVar3 = this->side;
  iVar2 = this->part;
  dVar4 = psVar3->textures[iVar2].xOffset;
  dVar5 = psVar3->textures[iVar2].yOffset;
  this->bakx = dVar4;
  this->baky = dVar5;
  dVar1 = this->oldx;
  if ((this->super_DInterpolation).refcount == 0) {
    dVar6 = this->oldy;
    if ((((dVar1 == dVar4) && (!NAN(dVar1) && !NAN(dVar4))) && (dVar6 == dVar5)) &&
       (!NAN(dVar6) && !NAN(dVar5))) {
      (*(this->super_DInterpolation).super_DObject._vptr_DObject[4])();
      return;
    }
  }
  else {
    dVar6 = this->oldy;
  }
  psVar3->textures[iVar2].xOffset = smoothratio * (dVar4 - dVar1) + dVar1;
  psVar3->textures[iVar2].yOffset = smoothratio * (dVar5 - dVar6) + dVar6;
  return;
}

Assistant:

void DWallScrollInterpolation::Interpolate(double smoothratio)
{
	bakx = side->GetTextureXOffset(part);
	baky = side->GetTextureYOffset(part);

	if (refcount == 0 && oldx == bakx && oldy == baky)
	{
		Destroy();
	}
	else
	{
		side->SetTextureXOffset(part, oldx + (bakx - oldx) * smoothratio);
		side->SetTextureYOffset(part, oldy + (baky - oldy) * smoothratio);
	}
}